

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

ArrayIndex __thiscall
anon_unknown.dwarf_b38497::CodemodelConfig::AddProject(CodemodelConfig *this,cmStateSnapshot s)

{
  cmStateSnapshot s_00;
  cmStateSnapshot s_01;
  ArrayIndex AVar1;
  bool bVar2;
  size_type sVar3;
  mapped_type_conflict3 *pmVar4;
  reference pvVar5;
  reference pvVar6;
  __type local_101;
  Value local_100;
  cmState *local_d8;
  cmState *pcStack_d0;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_c8;
  ArrayIndex local_bc;
  reference pvStack_b8;
  ArrayIndex parentDirIndex_1;
  Project *p;
  cmState *pcStack_a8;
  ArrayIndex projectIndex;
  cmState *local_a0;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_98;
  ArrayIndex local_8c;
  byte local_85;
  ArrayIndex parentDirIndex;
  string local_78;
  byte local_51;
  string local_50;
  undefined1 auStack_30 [8];
  cmStateSnapshot ps;
  CodemodelConfig *this_local;
  
  ps.Position.Position = (PositionType)this;
  cmStateSnapshot::GetBuildsystemDirectoryParent((cmStateSnapshot *)auStack_30,&s);
  bVar2 = cmStateSnapshot::IsValid((cmStateSnapshot *)auStack_30);
  local_51 = 0;
  local_85 = 0;
  local_101 = false;
  if (bVar2) {
    cmStateSnapshot::GetProjectName_abi_cxx11_(&local_50,(cmStateSnapshot *)auStack_30);
    local_51 = 1;
    cmStateSnapshot::GetProjectName_abi_cxx11_(&local_78,&s);
    local_85 = 1;
    local_101 = std::operator==(&local_50,&local_78);
  }
  if ((local_85 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_51 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  if (local_101 == false) {
    sVar3 = std::
            vector<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
            ::size(&this->Projects);
    p._4_4_ = (uint)sVar3;
    std::
    vector<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
    ::emplace_back<>(&this->Projects);
    pvStack_b8 = std::
                 vector<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
                 ::operator[](&this->Projects,(ulong)p._4_4_);
    AVar1 = p._4_4_;
    (pvStack_b8->Snapshot).State = s.State;
    (pvStack_b8->Snapshot).Position.Tree = s.Position.Tree;
    (pvStack_b8->Snapshot).Position.Position = s.Position.Position;
    pmVar4 = std::
             map<cmStateSnapshot,_unsigned_int,_cmStateSnapshot::StrictWeakOrder,_std::allocator<std::pair<const_cmStateSnapshot,_unsigned_int>_>_>
             ::operator[](&this->ProjectMap,&s);
    *pmVar4 = AVar1;
    bVar2 = cmStateSnapshot::IsValid((cmStateSnapshot *)auStack_30);
    if (bVar2) {
      local_c8 = ps.Position.Tree;
      local_d8 = (cmState *)auStack_30;
      pcStack_d0 = ps.State;
      s_01.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)ps.State;
      s_01.State = (cmState *)auStack_30;
      s_01.Position.Position = (PositionType)ps.Position.Tree;
      local_bc = GetDirectoryIndex(this,s_01);
      pvVar5 = std::
               vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
               ::operator[](&this->Directories,(ulong)local_bc);
      pvStack_b8->ParentIndex = pvVar5->ProjectIndex;
      pvVar6 = std::
               vector<(anonymous_namespace)::CodemodelConfig::Project,_std::allocator<(anonymous_namespace)::CodemodelConfig::Project>_>
               ::operator[](&this->Projects,(ulong)pvStack_b8->ParentIndex);
      Json::Value::Value(&local_100,p._4_4_);
      Json::Value::append(&pvVar6->ChildIndexes,&local_100);
      Json::Value::~Value(&local_100);
    }
    this_local._4_4_ = p._4_4_;
  }
  else {
    pcStack_a8 = (cmState *)auStack_30;
    local_a0 = ps.State;
    local_98 = ps.Position.Tree;
    s_00.Position.Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)ps.State;
    s_00.State = (cmState *)auStack_30;
    s_00.Position.Position = (PositionType)ps.Position.Tree;
    local_8c = GetDirectoryIndex(this,s_00);
    pvVar5 = std::
             vector<(anonymous_namespace)::CodemodelConfig::Directory,_std::allocator<(anonymous_namespace)::CodemodelConfig::Directory>_>
             ::operator[](&this->Directories,(ulong)local_8c);
    this_local._4_4_ = pvVar5->ProjectIndex;
  }
  return this_local._4_4_;
}

Assistant:

Json::ArrayIndex CodemodelConfig::AddProject(cmStateSnapshot s)
{
  cmStateSnapshot ps = s.GetBuildsystemDirectoryParent();
  if (ps.IsValid() && ps.GetProjectName() == s.GetProjectName()) {
    // This directory is part of its parent directory project.
    Json::ArrayIndex const parentDirIndex = this->GetDirectoryIndex(ps);
    return this->Directories[parentDirIndex].ProjectIndex;
  }

  // This directory starts a new project.
  auto projectIndex = static_cast<Json::ArrayIndex>(this->Projects.size());
  this->Projects.emplace_back();
  Project& p = this->Projects[projectIndex];
  p.Snapshot = s;
  this->ProjectMap[s] = projectIndex;
  if (ps.IsValid()) {
    Json::ArrayIndex const parentDirIndex = this->GetDirectoryIndex(ps);
    p.ParentIndex = this->Directories[parentDirIndex].ProjectIndex;
    this->Projects[p.ParentIndex].ChildIndexes.append(projectIndex);
  }
  return projectIndex;
}